

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O2

bool __thiscall
FirewirePort::ReadQuadletNode
          (FirewirePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t *data,uchar param_4)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_49;
  string local_48 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_48,"FirewirePort::ReadQuadlet",&local_49)
  ;
  iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,local_48,0);
  std::__cxx11::string::~string(local_48);
  if (((char)iVar2 != '\0') &&
     (iVar2 = raw1394_read(this->handle,node + this->baseNodeId,addr,4,data), iVar2 == 0)) {
    uVar1 = *data;
    *data = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    return true;
  }
  return false;
}

Assistant:

bool FirewirePort::ReadQuadletNode(nodeid_t node, nodeaddr_t addr, quadlet_t &data, unsigned char)
{
    if (!CheckFwBusGeneration("FirewirePort::ReadQuadlet"))
        return false;

    bool ret = !raw1394_read(handle, baseNodeId+node, addr, 4, &data);
    if (ret)
        data = bswap_32(data);
    return ret;
}